

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O0

int asn1_string_get_abs_uint64(uint64_t *out,ASN1_STRING *a,int type)

{
  uint64_t uVar1;
  undefined1 local_2c [8];
  uint8_t buf [8];
  int type_local;
  ASN1_STRING *a_local;
  uint64_t *out_local;
  
  buf._0_4_ = type;
  unique0x10000119 = a;
  if ((a->type & 0xfffffeffU) == type) {
    memset(local_2c,0,8);
    if (stack0xffffffffffffffe0->length < 9) {
      OPENSSL_memcpy(buf + -(long)stack0xffffffffffffffe0->length,stack0xffffffffffffffe0->data,
                     (long)stack0xffffffffffffffe0->length);
      uVar1 = CRYPTO_load_u64_be(local_2c);
      *out = uVar1;
      out_local._4_4_ = 1;
    }
    else {
      ERR_put_error(0xc,0,0xc4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                    ,0x125);
      out_local._4_4_ = 0;
    }
  }
  else {
    ERR_put_error(0xc,0,0xc3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                  ,0x120);
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

static int asn1_string_get_abs_uint64(uint64_t *out, const ASN1_STRING *a,
                                      int type) {
  if ((a->type & ~V_ASN1_NEG) != type) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_INTEGER_TYPE);
    return 0;
  }
  uint8_t buf[sizeof(uint64_t)] = {0};
  if (a->length > (int)sizeof(buf)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_INTEGER);
    return 0;
  }
  OPENSSL_memcpy(buf + sizeof(buf) - a->length, a->data, a->length);
  *out = CRYPTO_load_u64_be(buf);
  return 1;
}